

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImVector<ImDrawCmd>::push_front(ImVector<ImDrawCmd> *this,ImDrawCmd *v)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  ImTextureID pvVar4;
  ImDrawCallback p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImDrawCmd *pIVar9;
  uint uVar10;
  uint uVar11;
  
  iVar1 = this->Size;
  if (iVar1 == 0) {
    if (this->Capacity == 0) {
      pIVar9 = (ImDrawCmd *)ImGui::MemAlloc(0x1c0);
      if (this->Data != (ImDrawCmd *)0x0) {
        memcpy(pIVar9,this->Data,(long)this->Size * 0x38);
        ImGui::MemFree(this->Data);
      }
      this->Data = pIVar9;
      this->Capacity = 8;
    }
    pIVar9 = this->Data + this->Size;
  }
  else {
    if (iVar1 < 0) {
      __assert_fail("it >= Data && it <= Data+Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                    ,0x4f2,"T *ImVector<ImDrawCmd>::insert(const T *, const T &) [T = ImDrawCmd]");
    }
    iVar2 = this->Capacity;
    if (iVar1 == iVar2) {
      if (iVar2 == 0) {
        uVar10 = 8;
      }
      else {
        uVar10 = iVar2 / 2 + iVar2;
      }
      uVar11 = iVar1 + 1U;
      if ((int)(iVar1 + 1U) < (int)uVar10) {
        uVar11 = uVar10;
      }
      if (iVar2 < (int)uVar11) {
        pIVar9 = (ImDrawCmd *)ImGui::MemAlloc((ulong)uVar11 * 0x38);
        if (this->Data != (ImDrawCmd *)0x0) {
          memcpy(pIVar9,this->Data,(long)this->Size * 0x38);
          ImGui::MemFree(this->Data);
        }
        this->Data = pIVar9;
        this->Capacity = uVar11;
      }
    }
    if (0 < (long)this->Size) {
      memmove(this->Data + 1,this->Data,(long)this->Size * 0x38);
    }
    pIVar9 = this->Data;
  }
  pIVar9->UserCallbackData = v->UserCallbackData;
  uVar11 = v->ElemCount;
  fVar6 = (v->ClipRect).x;
  fVar7 = (v->ClipRect).y;
  fVar8 = (v->ClipRect).z;
  uVar3 = *(undefined8 *)&(v->ClipRect).w;
  pvVar4 = v->TextureId;
  uVar10 = v->IdxOffset;
  p_Var5 = v->UserCallback;
  pIVar9->VtxOffset = v->VtxOffset;
  pIVar9->IdxOffset = uVar10;
  pIVar9->UserCallback = p_Var5;
  *(undefined8 *)&(pIVar9->ClipRect).w = uVar3;
  pIVar9->TextureId = pvVar4;
  pIVar9->ElemCount = uVar11;
  (pIVar9->ClipRect).x = fVar6;
  (pIVar9->ClipRect).y = fVar7;
  (pIVar9->ClipRect).z = fVar8;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }